

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# putcolk.c
# Opt level: O2

int ffintfi4(int *input,long ntodo,double scale,double zero,int *output,int *status)

{
  long lVar1;
  int iVar2;
  double dVar3;
  
  if ((((scale != 1.0) || (NAN(scale))) || (zero != 0.0)) || (NAN(zero))) {
    lVar1 = 0;
    if (ntodo < 1) {
      ntodo = lVar1;
    }
    for (; ntodo != lVar1; lVar1 = lVar1 + 1) {
      dVar3 = ((double)input[lVar1] - zero) / scale;
      if (-2147483648.49 <= dVar3) {
        if (dVar3 <= 2147483647.49) {
          if (0.0 <= dVar3) {
            dVar3 = dVar3 + 0.5;
          }
          else {
            dVar3 = dVar3 + -0.5;
          }
          iVar2 = (int)dVar3;
        }
        else {
          *status = -0xb;
          iVar2 = 0x7fffffff;
        }
      }
      else {
        *status = -0xb;
        iVar2 = -0x80000000;
      }
      output[lVar1] = iVar2;
    }
  }
  else {
    memcpy(output,input,ntodo << 2);
  }
  return *status;
}

Assistant:

int ffintfi4(int *input,       /* I - array of values to be converted  */
            long ntodo,        /* I - number of elements in the array  */
            double scale,      /* I - FITS TSCALn or BSCALE value      */
            double zero,       /* I - FITS TZEROn or BZERO  value      */
            INT32BIT *output,      /* O - output array of converted values */
            int *status)       /* IO - error status                    */
/*
  Copy input to output prior to writing output to a FITS file.
  Do datatype conversion and scaling if required
*/
{
    long ii;
    double dvalue;

    if (scale == 1. && zero == 0.)  
    {       
        memcpy(output, input, ntodo * sizeof(int) );
    }
    else
    {
        for (ii = 0; ii < ntodo; ii++)
        {
            dvalue = (input[ii] - zero) / scale;

            if (dvalue < DINT_MIN)
            {
                *status = OVERFLOW_ERR;
                output[ii] = INT32_MIN;
            }
            else if (dvalue > DINT_MAX)
            {
                *status = OVERFLOW_ERR;
                output[ii] = INT32_MAX;
            }
            else
            {
                if (dvalue >= 0)
                    output[ii] = (INT32BIT) (dvalue + .5);
                else
                    output[ii] = (INT32BIT) (dvalue - .5);
            }
        }
    }
    return(*status);
}